

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::copyable_holder_caster<anurbs::Line<3L>,_std::shared_ptr<anurbs::Line<3L>_>_>::
load_value(copyable_holder_caster<anurbs::Line<3L>,_std::shared_ptr<anurbs::Line<3L>_>_> *this,
          value_and_holder *v_h)

{
  bool bVar1;
  void **ppvVar2;
  shared_ptr<anurbs::Line<3L>_> *psVar3;
  cast_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  value_and_holder *local_18;
  value_and_holder *v_h_local;
  copyable_holder_caster<anurbs::Line<3L>,_std::shared_ptr<anurbs::Line<3L>_>_> *this_local;
  
  local_18 = v_h;
  v_h_local = (value_and_holder *)this;
  bVar1 = value_and_holder::holder_constructed(v_h);
  if (!bVar1) {
    this_00 = (cast_error *)__cxa_allocate_exception(0x10);
    type_id<std::shared_ptr<anurbs::Line<3l>>>();
    std::operator+(&local_58,
                   "Unable to cast from non-held to held instance (T& to Holder<T>) of type \'",
                   &local_78);
    std::operator+(&local_38,&local_58,"\'\'");
    cast_error::runtime_error(this_00,&local_38);
    __cxa_throw(this_00,&cast_error::typeinfo,cast_error::~cast_error);
  }
  ppvVar2 = value_and_holder::value_ptr<void>(local_18);
  (this->super_type_caster_base<anurbs::Line<3L>_>).super_type_caster_generic.value = *ppvVar2;
  psVar3 = value_and_holder::holder<std::shared_ptr<anurbs::Line<3l>>>(local_18);
  std::shared_ptr<anurbs::Line<3L>_>::operator=(&this->holder,psVar3);
  return true;
}

Assistant:

bool load_value(value_and_holder &&v_h) {
        if (v_h.holder_constructed()) {
            value = v_h.value_ptr();
            holder = v_h.template holder<holder_type>();
            return true;
        } else {
            throw cast_error("Unable to cast from non-held to held instance (T& to Holder<T>) "
#if defined(NDEBUG)
                             "(compile in debug mode for type information)");
#else
                             "of type '" + type_id<holder_type>() + "''");
#endif
        }
    }